

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_stcke(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar1;
  int iVar2;
  TCGv_i64 retval;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  retval = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  gen_helper_stck(tcg_ctx,retval,tcg_ctx->cpu_env);
  tcg_gen_ld32u_i64_s390x(tcg_ctx,ret_00,tcg_ctx->cpu_env,0x400);
  tcg_gen_shli_i64_s390x(tcg_ctx,ret,retval,0x38);
  tcg_gen_shri_i64_s390x(tcg_ctx,retval,retval,8);
  tcg_gen_ori_i64_s390x(tcg_ctx,ret,ret,0x10000);
  tcg_gen_or_i64_s390x(tcg_ctx,ret,ret,ret_00);
  pTVar1 = o->in2;
  iVar2 = get_mem_index(s);
  tcg_gen_qemu_st64(tcg_ctx,retval,pTVar1,iVar2);
  tcg_gen_addi_i64_s390x(tcg_ctx,o->in2,o->in2,8);
  pTVar1 = o->in2;
  iVar2 = get_mem_index(s);
  tcg_gen_qemu_st64(tcg_ctx,ret,pTVar1,iVar2);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  gen_op_movi_cc(s,0);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_stcke(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 c1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 c2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 todpr = tcg_temp_new_i64(tcg_ctx);
    gen_helper_stck(tcg_ctx, c1, tcg_ctx->cpu_env);
    /* 16 bit value store in an uint32_t (only valid bits set) */
    tcg_gen_ld32u_i64(tcg_ctx, todpr, tcg_ctx->cpu_env, offsetof(CPUS390XState, todpr));
    /* Shift the 64-bit value into its place as a zero-extended
       104-bit value.  Note that "bit positions 64-103 are always
       non-zero so that they compare differently to STCK"; we set
       the least significant bit to 1.  */
    tcg_gen_shli_i64(tcg_ctx, c2, c1, 56);
    tcg_gen_shri_i64(tcg_ctx, c1, c1, 8);
    tcg_gen_ori_i64(tcg_ctx, c2, c2, 0x10000);
    tcg_gen_or_i64(tcg_ctx, c2, c2, todpr);
    tcg_gen_qemu_st64(tcg_ctx, c1, o->in2, get_mem_index(s));
    tcg_gen_addi_i64(tcg_ctx, o->in2, o->in2, 8);
    tcg_gen_qemu_st64(tcg_ctx, c2, o->in2, get_mem_index(s));
    tcg_temp_free_i64(tcg_ctx, c1);
    tcg_temp_free_i64(tcg_ctx, c2);
    tcg_temp_free_i64(tcg_ctx, todpr);
    /* ??? We don't implement clock states.  */
    gen_op_movi_cc(s, 0);
    return DISAS_NEXT;
}